

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatCnfReader.c
# Opt level: O2

void skipLine(char **pIn)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar2 = *pIn;
  while( true ) {
    pcVar1 = pcVar2 + 1;
    if (*pcVar2 == '\0') {
      return;
    }
    if (*pcVar2 == '\n') break;
    *pIn = pcVar1;
    pcVar2 = pcVar1;
  }
  *pIn = pcVar1;
  return;
}

Assistant:

static void skipLine( char ** pIn )
{
    while ( 1 )
    {
        if (**pIn == 0)
            return;
        if (**pIn == '\n')
        {
            (*pIn)++;
            return;
        }
        (*pIn)++;
    }
}